

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O3

string * __thiscall
pbrt::DielectricInterfaceBxDF::ToString_abi_cxx11_
          (string *__return_storage_ptr__,DielectricInterfaceBxDF *this)

{
  string local_40;
  
  TrowbridgeReitzDistribution::ToString_abi_cxx11_(&local_40,&this->mfDistrib);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&,std::__cxx11::string,pbrt::SampledSpectrum_const&>
            (__return_storage_ptr__,"[ DielectricInterfaceBxDF eta: %f mfDistrib: %s tint: %s ]",
             &this->eta,&local_40,&this->tint);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DielectricInterfaceBxDF::ToString() const {
    return StringPrintf("[ DielectricInterfaceBxDF eta: %f mfDistrib: %s tint: %s ]", eta,
                        mfDistrib.ToString(), tint);
}